

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O2

compile_errcode __thiscall FunctionCall::Parse(FunctionCall *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  compile_errcode cVar2;
  undefined4 uVar3;
  allocator local_51;
  string local_50;
  
  uVar3 = 0;
LAB_00136898:
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(uVar3) {
    case 0:
      uVar3 = 1;
      if (SVar1 != IDENTIFIER_SYM) {
        return -1;
      }
      break;
    case 1:
      uVar3 = 2;
      if (SVar1 != L_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      break;
    case 2:
      goto switchD_001368ae_caseD_2;
    case 3:
      uVar3 = 4;
      if (SVar1 != R_CIRCLE_BRACKET_SYM) {
        std::__cxx11::string::string
                  ((string *)&local_50,"expected a \')\' in function call",&local_51);
        GrammaErrorLogs(log_tools_ptr,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        return -1;
      }
      break;
    case 4:
      return 0;
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
switchD_001368ae_caseD_2:
  cVar2 = ValueArgumentList::Parse(&this->m_value_argument_list);
  uVar3 = 3;
  if (cVar2 != 0) {
    return -1;
  }
  goto LAB_00136898;
}

Assistant:

compile_errcode FunctionCall::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == IDENTIFIER_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_value_argument_list.Parse()) == COMPILE_OK) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')' in function call");
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_symbol_queue->NextSymbol();
    }
}